

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

int __thiscall MT32Emu::Synth::open(Synth *this,char *__file,int __oflag,...)

{
  float fVar1;
  ushort uVar2;
  RendererType RVar3;
  ControlROMMap *pCVar4;
  MemParams *pMVar5;
  Extensions *pEVar6;
  PatchParam *pPVar7;
  bool bVar8;
  Bit16s *pBVar9;
  PartialManager *this_00;
  PCMWaveEntry *pPVar10;
  char (*pacVar11) [9];
  Part *this_01;
  RhythmPart *this_02;
  MidiEventQueue *this_03;
  Analog *pAVar12;
  Renderer *pRVar13;
  Display *this_04;
  Bit32u in_ECX;
  ulong uVar14;
  Bit8u *pBVar15;
  size_t sVar16;
  undefined8 in_R8;
  long lVar17;
  long lVar18;
  float fVar19;
  
  if (this->opened != false) {
    return 0;
  }
  this->partialCount = in_ECX;
  this->abortingPoly = (Poly *)0x0;
  this->extensions->abortingPartIx = 0;
  memset(this->mt32ram,0x3f,0x10dab);
  bVar8 = loadControlROM(this,(ROMImage *)__file);
  if (bVar8) {
    initMemoryRegions(this);
    sVar16 = (ulong)(this->controlROMMap->pcmCount == 0x100) * 0x40000 + 0x40000;
    this->pcmROMSize = sVar16;
    pBVar9 = (Bit16s *)operator_new__((ulong)(uint)((int)sVar16 * 2));
    this->pcmROMData = pBVar9;
    bVar8 = loadPCMROM(this,___oflag);
    if (bVar8) {
      initReverbModels(this,(bool)((byte)((ushort)*(undefined2 *)this->controlROMFeatures >> 10) & 1
                                  ));
      pCVar4 = this->controlROMMap;
      bVar8 = initTimbres(this,pCVar4->timbreAMap,pCVar4->timbreAOffset,0x40,0,
                          pCVar4->timbreACompressed);
      if (bVar8) {
        pCVar4 = this->controlROMMap;
        bVar8 = initTimbres(this,pCVar4->timbreBMap,pCVar4->timbreBOffset,0x40,0x40,
                            pCVar4->timbreBCompressed);
        if ((bVar8) &&
           (bVar8 = initTimbres(this,this->controlROMMap->timbreRMap,0,
                                this->controlROMMap->timbreRCount,0xc0,true), bVar8)) {
          if (this->controlROMMap->timbreRCount == 0x1e) {
            memcpy(this->mt32ram->timbres + 0xde,this->mt32ram->timbres + 0xc0,0x1e00);
            memset(this->mt32ram->timbres + 0xfc,0,0x400);
          }
          memset(this->mt32ram->timbres + 0x80,0,0x4000);
          this_00 = (PartialManager *)operator_new(0x40);
          PartialManager::PartialManager(this_00,this,this->parts);
          this->partialManager = this_00;
          pCVar4 = this->controlROMMap;
          uVar2 = pCVar4->pcmCount;
          pPVar10 = (PCMWaveEntry *)operator_new__((ulong)((uint)uVar2 * 8) * 3);
          this->pcmWaves = pPVar10;
          initPCMList(this,pCVar4->pcmTable,uVar2);
          memcpy(this->mt32ram->rhythmTemp,
                 this->controlROMData + this->controlROMMap->rhythmSettings,
                 (ulong)this->controlROMMap->rhythmSettingsCount << 2);
          pMVar5 = this->mt32ram;
          uVar14 = 0;
          do {
            pMVar5->patches[uVar14].timbreGroup = (byte)((uVar14 & 0xffffffff) >> 6) & 3;
            pMVar5->patches[uVar14].timbreNum = (byte)uVar14 & 0x3f;
            pPVar7 = pMVar5->patches + uVar14;
            pPVar7->keyShift = '\x18';
            pPVar7->fineTune = '2';
            pPVar7->benderRange = '\f';
            pPVar7->assignMode = '\0';
            pMVar5->patches[uVar14].reverbSwitch = '\x01';
            pMVar5->patches[uVar14].dummy = '\0';
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x80);
          (pMVar5->system).masterTune = 'J';
          (pMVar5->system).reverbMode = '\0';
          (pMVar5->system).reverbTime = '\x05';
          (pMVar5->system).reverbLevel = '\x03';
          uVar14 = (ulong)this->controlROMMap->reserveSettings;
          (pMVar5->system).reserveSettings[8] = this->controlROMData[uVar14 + 8];
          *(undefined8 *)(pMVar5->system).reserveSettings =
               *(undefined8 *)(this->controlROMData + uVar14);
          lVar17 = 0;
          do {
            lVar18 = lVar17 + 1;
            (this->mt32ram->system).chanAssign[lVar17] = (Bit8u)lVar18;
            lVar17 = lVar18;
          } while (lVar18 != 9);
          (this->mt32ram->system).masterVol = 'd';
          bVar8 = this->reverbOverridden;
          this->reverbOverridden = false;
          refreshSystem(this);
          this->extensions->masterTunePitchDelta = 0;
          this->reverbOverridden = bVar8;
          pCVar4 = this->controlROMMap;
          pacVar11 = (char (*) [9])operator_new__((ulong)pCVar4->soundGroupsCount * 9);
          this->soundGroupNames = pacVar11;
          memcpy(this->soundGroupIx,this->controlROMData + ((ulong)pCVar4->soundGroupsTable - 0x80),
                 0x80);
          uVar2 = pCVar4->soundGroupsCount;
          if ((ulong)uVar2 != 0) {
            pBVar15 = this->controlROMData + (ulong)pCVar4->soundGroupsTable + 3;
            uVar14 = 0;
            do {
              (*pacVar11)[8] = pBVar15[8];
              *(undefined8 *)*pacVar11 = *(undefined8 *)pBVar15;
              uVar14 = uVar14 + 1;
              pBVar15 = pBVar15 + 0xe;
              pacVar11 = pacVar11 + 1;
            } while (uVar14 < uVar2);
          }
          lVar17 = 0xb;
          lVar18 = 0;
          while( true ) {
            pMVar5 = this->mt32ram;
            *(undefined8 *)(pMVar5->patchTemp[0].dummyv + lVar17 + -0x15) = 0x1000c32180000;
            pMVar5->patchTemp[0].dummyv[lVar17 + -0xd] = 'P';
            pMVar5->patchTemp[0].dummyv[lVar17 + -0xc] =
                 this->controlROMData[lVar18 + (ulong)this->controlROMMap->panSettings];
            pBVar15 = pMVar5->patchTemp[0].dummyv + lVar17 + -0xb;
            pBVar15[0] = '\0';
            pBVar15[1] = '\0';
            pBVar15[2] = '\0';
            pBVar15[3] = '\0';
            pBVar15 = pMVar5->patchTemp[0].dummyv + lVar17 + -7;
            pBVar15[0] = '\0';
            pBVar15[1] = '\0';
            pMVar5->patchTemp[0].dummyv[lVar17 + -10] = '\x7f';
            if (lVar18 == 8) break;
            this_01 = (Part *)operator_new(0x208);
            Part::Part(this_01,this,(uint)lVar18);
            this->parts[lVar18] = this_01;
            (*this_01->_vptr_Part[5])
                      (this_01,(ulong)this->controlROMData
                                      [lVar18 + (ulong)this->controlROMMap->programSettings]);
            lVar18 = lVar18 + 1;
            lVar17 = lVar17 + 0x10;
          }
          this_02 = (RhythmPart *)operator_new(0x8c30);
          RhythmPart::RhythmPart(this_02,this,8);
          this->parts[8] = (Part *)this_02;
          memcpy(this->mt32default,this->mt32ram,0x10dab);
          this_03 = (MidiEventQueue *)operator_new(0x20);
          MidiEventQueue::MidiEventQueue
                    (this_03,this->extensions->midiEventQueueSize,
                     this->extensions->midiEventQueueSysexStorageBufferSize);
          this->midiQueue = this_03;
          pAVar12 = Analog::createAnalog
                              ((AnalogOutputMode)in_R8,
                               (bool)((byte)((ushort)*(undefined2 *)this->controlROMFeatures >> 0xb)
                                     & 1),this->extensions->selectedRendererType);
          this->analog = pAVar12;
          fVar1 = this->outputGain;
          fVar19 = -fVar1;
          if (-fVar1 <= fVar1) {
            fVar19 = fVar1;
          }
          this->outputGain = fVar19;
          if (pAVar12 != (Analog *)0x0) {
            (*pAVar12->_vptr_Analog[4])(pAVar12);
          }
          setReverbOutputGain(this,this->reverbOutputGain);
          RVar3 = this->extensions->selectedRendererType;
          if (RVar3 == RendererType_BIT16S) {
            pRVar13 = (Renderer *)operator_new(0xc040);
            pRVar13->synth = this;
            pRVar13->_vptr_Renderer = (_func_int **)&PTR__Renderer_00133f70;
            pRVar13[0xc01]._vptr_Renderer = (_func_int **)(pRVar13 + 1);
            pRVar13[0xc01].synth = (Synth *)(pRVar13 + 0x201);
            pRVar13[0xc02]._vptr_Renderer = (_func_int **)(pRVar13 + 0x401);
            pRVar13[0xc02].synth = (Synth *)(pRVar13 + 0x601);
            pRVar13[0xc03]._vptr_Renderer = (_func_int **)(pRVar13 + 0x801);
            pRVar13[0xc03].synth = (Synth *)(pRVar13 + 0xa01);
          }
          else {
            if (RVar3 != RendererType_FLOAT) {
              printDebug(this,"Synth: Unknown renderer type %i\n");
              goto LAB_001139ab;
            }
            pRVar13 = (Renderer *)operator_new(0x18040);
            pRVar13->synth = this;
            pRVar13->_vptr_Renderer = (_func_int **)&PTR__Renderer_00133fd8;
            pRVar13[0x1801]._vptr_Renderer = (_func_int **)(pRVar13 + 1);
            pRVar13[0x1801].synth = (Synth *)(pRVar13 + 0x401);
            pRVar13[0x1802]._vptr_Renderer = (_func_int **)(pRVar13 + 0x801);
            pRVar13[0x1802].synth = (Synth *)(pRVar13 + 0xc01);
            pRVar13[0x1803]._vptr_Renderer = (_func_int **)(pRVar13 + 0x1001);
            pRVar13[0x1803].synth = (Synth *)(pRVar13 + 0x1401);
          }
          this->renderer = pRVar13;
          this_04 = (Display *)operator_new(0x70);
          Display::Display(this_04,this);
          pEVar6 = this->extensions;
          pEVar6->display = this_04;
          pEVar6->oldMT32DisplayFeatures =
               (bool)((byte)((ushort)*(undefined2 *)this->controlROMFeatures >> 9) & 1);
          this->opened = true;
          this->activated = false;
          return (int)CONCAT71((uint7)((ulong)in_R8 >> 8) & 0xffffff,1);
        }
      }
      dispose(this);
      return 0;
    }
    printDebug(this,"Init Error - Missing PCM ROM image");
    (*this->reportHandler->_vptr_ReportHandler[4])();
  }
  else {
    printDebug(this,"Init Error - Missing or invalid Control ROM image");
    (*this->reportHandler->_vptr_ReportHandler[3])();
  }
LAB_001139ab:
  dispose(this);
  return 0;
}

Assistant:

bool Synth::open(const ROMImage &controlROMImage, const ROMImage &pcmROMImage, Bit32u usePartialCount, AnalogOutputMode analogOutputMode) {
	if (opened) {
		return false;
	}
	partialCount = usePartialCount;
	abortingPoly = NULL;
	extensions.abortingPartIx = 0;

	// This is to help detect bugs
	memset(&mt32ram, '?', sizeof(mt32ram));

#if MT32EMU_MONITOR_INIT
	printDebug("Loading Control ROM");
#endif
	if (!loadControlROM(controlROMImage)) {
		printDebug("Init Error - Missing or invalid Control ROM image");
		reportHandler->onErrorControlROM();
		dispose();
		return false;
	}

	initMemoryRegions();

	// 512KB PCM ROM for MT-32, etc.
	// 1MB PCM ROM for CM-32L, LAPC-I, CM-64, CM-500
	// Note that the size below is given in samples (16-bit), not bytes
	pcmROMSize = controlROMMap->pcmCount == 256 ? 512 * 1024 : 256 * 1024;
	pcmROMData = new Bit16s[pcmROMSize];

#if MT32EMU_MONITOR_INIT
	printDebug("Loading PCM ROM");
#endif
	if (!loadPCMROM(pcmROMImage)) {
		printDebug("Init Error - Missing PCM ROM image");
		reportHandler->onErrorPCMROM();
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Reverb Models");
#endif
	bool mt32CompatibleReverb = controlROMFeatures->defaultReverbMT32Compatible;
#if MT32EMU_MONITOR_INIT
	printDebug("Using %s Compatible Reverb Models", mt32CompatibleReverb ? "MT-32" : "CM-32L");
#endif
	initReverbModels(mt32CompatibleReverb);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank A");
#endif
	if (!initTimbres(controlROMMap->timbreAMap, controlROMMap->timbreAOffset, 0x40, 0, controlROMMap->timbreACompressed)) {
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank B");
#endif
	if (!initTimbres(controlROMMap->timbreBMap, controlROMMap->timbreBOffset, 0x40, 64, controlROMMap->timbreBCompressed)) {
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank R");
#endif
	if (!initTimbres(controlROMMap->timbreRMap, 0, controlROMMap->timbreRCount, 192, true)) {
		dispose();
		return false;
	}

	if (controlROMMap->timbreRCount == 30) {
		// We must initialise all 64 rhythm timbres to avoid undefined behaviour.
		// SEMI-CONFIRMED: Old-gen MT-32 units likely map timbres 30..59 to 0..29.
		// Attempts to play rhythm timbres 60..63 exhibit undefined behaviour.
		// We want to emulate the wrap around, so merely copy the entire set of standard
		// timbres once more. The last 4 dangerous timbres are zeroed out.
		memcpy(&mt32ram.timbres[222], &mt32ram.timbres[192], sizeof(*mt32ram.timbres) * 30);
		memset(&mt32ram.timbres[252], 0, sizeof(*mt32ram.timbres) * 4);
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank M");
#endif
	// CM-64 seems to initialise all bytes in this bank to 0.
	memset(&mt32ram.timbres[128], 0, sizeof(mt32ram.timbres[128]) * 64);

	partialManager = new PartialManager(this, parts);

	pcmWaves = new PCMWaveEntry[controlROMMap->pcmCount];

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising PCM List");
#endif
	initPCMList(controlROMMap->pcmTable, controlROMMap->pcmCount);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Rhythm Temp");
#endif
	memcpy(mt32ram.rhythmTemp, &controlROMData[controlROMMap->rhythmSettings], controlROMMap->rhythmSettingsCount * 4);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Patches");
#endif
	for (Bit8u i = 0; i < 128; i++) {
		PatchParam *patch = &mt32ram.patches[i];
		patch->timbreGroup = i / 64;
		patch->timbreNum = i % 64;
		patch->keyShift = 24;
		patch->fineTune = 50;
		patch->benderRange = 12;
		patch->assignMode = 0;
		patch->reverbSwitch = 1;
		patch->dummy = 0;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising System");
#endif
	// The MT-32 manual claims that "Standard pitch" is 442Hz.
	mt32ram.system.masterTune = 0x4A; // Confirmed on CM-64
	mt32ram.system.reverbMode = 0; // Confirmed
	mt32ram.system.reverbTime = 5; // Confirmed
	mt32ram.system.reverbLevel = 3; // Confirmed
	memcpy(mt32ram.system.reserveSettings, &controlROMData[controlROMMap->reserveSettings], 9); // Confirmed
	for (Bit8u i = 0; i < 9; i++) {
		// This is the default: {1, 2, 3, 4, 5, 6, 7, 8, 9}
		// An alternative configuration can be selected by holding "Master Volume"
		// and pressing "PART button 1" on the real MT-32's frontpanel.
		// The channel assignment is then {0, 1, 2, 3, 4, 5, 6, 7, 9}
		mt32ram.system.chanAssign[i] = i + 1;
	}
	mt32ram.system.masterVol = 100; // Confirmed

	bool oldReverbOverridden = reverbOverridden;
	reverbOverridden = false;
	refreshSystem();
	resetMasterTunePitchDelta();
	reverbOverridden = oldReverbOverridden;

	char(*writableSoundGroupNames)[9] = new char[controlROMMap->soundGroupsCount][9];
	soundGroupNames = writableSoundGroupNames;
	initSoundGroups(writableSoundGroupNames);

	for (int i = 0; i < 9; i++) {
		MemParams::PatchTemp *patchTemp = &mt32ram.patchTemp[i];

		// Note that except for the rhythm part, these patch fields will be set in setProgram() below anyway.
		patchTemp->patch.timbreGroup = 0;
		patchTemp->patch.timbreNum = 0;
		patchTemp->patch.keyShift = 24;
		patchTemp->patch.fineTune = 50;
		patchTemp->patch.benderRange = 12;
		patchTemp->patch.assignMode = 0;
		patchTemp->patch.reverbSwitch = 1;
		patchTemp->patch.dummy = 0;

		patchTemp->outputLevel = 80;
		patchTemp->panpot = controlROMData[controlROMMap->panSettings + i];
		memset(patchTemp->dummyv, 0, sizeof(patchTemp->dummyv));
		patchTemp->dummyv[1] = 127;

		if (i < 8) {
			parts[i] = new Part(this, i);
			parts[i]->setProgram(controlROMData[controlROMMap->programSettings + i]);
		} else {
			parts[i] = new RhythmPart(this, i);
		}
	}

	// For resetting mt32 mid-execution
	mt32default = mt32ram;

	midiQueue = new MidiEventQueue(extensions.midiEventQueueSize, extensions.midiEventQueueSysexStorageBufferSize);

	analog = Analog::createAnalog(analogOutputMode, controlROMFeatures->oldMT32AnalogLPF, getSelectedRendererType());
#if MT32EMU_MONITOR_INIT
	static const char *ANALOG_OUTPUT_MODES[] = { "Digital only", "Coarse", "Accurate", "Oversampled2x" };
	printDebug("Using Analog output mode %s", ANALOG_OUTPUT_MODES[analogOutputMode]);
#endif
	setOutputGain(outputGain);
	setReverbOutputGain(reverbOutputGain);

	switch (getSelectedRendererType()) {
		case RendererType_BIT16S:
			renderer = new RendererImpl<IntSample>(*this);
#if MT32EMU_MONITOR_INIT
			printDebug("Using integer 16-bit samples in renderer and wave generator");
#endif
			break;
		case RendererType_FLOAT:
			renderer = new RendererImpl<FloatSample>(*this);
#if MT32EMU_MONITOR_INIT
			printDebug("Using float 32-bit samples in renderer and wave generator");
#endif
			break;
		default:
			printDebug("Synth: Unknown renderer type %i\n", getSelectedRendererType());
			dispose();
			return false;
	}

	extensions.display = new Display(*this);
	extensions.oldMT32DisplayFeatures = controlROMFeatures->oldMT32DisplayFeatures;

	opened = true;
	activated = false;

#if MT32EMU_MONITOR_INIT
	printDebug("*** Initialisation complete ***");
#endif
	return true;
}